

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O3

BufferWithRandomAccess * __thiscall
wasm::BufferWithRandomAccess::operator<<(BufferWithRandomAccess *this,int32_t x)

{
  bool bVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"writeInt32: ",0xc);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," (at ",5);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
  }
  uStack_28._0_5_ = CONCAT14((char)x,(undefined4)uStack_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)((long)&uStack_28 + 4));
  uStack_28 = CONCAT17((char)((uint)x >> 8),(undefined7)uStack_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)((long)&uStack_28 + 7));
  uStack_28._0_6_ = CONCAT15((char)((uint)x >> 0x10),(undefined5)uStack_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)((long)&uStack_28 + 5));
  uStack_28._0_7_ = CONCAT16((char)((uint)x >> 0x18),(undefined6)uStack_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)((long)&uStack_28 + 6));
  return this;
}

Assistant:

BufferWithRandomAccess& operator<<(int32_t x) {
    BYN_TRACE("writeInt32: " << x << " (at " << size() << ")\n");
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    return *this;
  }